

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O0

void __thiscall Omega_h::InputMap::set(InputMap *this,string *name,char *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  InputScalar *this_00;
  allocator local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  shared_ptr<Omega_h::Input> sptr;
  char *value_local;
  string *name_local;
  InputMap *this_local;
  
  sptr.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value;
  this_00 = (InputScalar *)operator_new(0x38);
  _Var1._M_pi = sptr.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,(char *)_Var1._M_pi,&local_51);
  InputScalar::InputScalar(this_00,(string *)local_50);
  std::shared_ptr<Omega_h::Input>::shared_ptr<Omega_h::InputScalar,void>
            ((shared_ptr<Omega_h::Input> *)local_30,this_00);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  add(this,name,(shared_ptr<Omega_h::Input> *)local_30);
  std::shared_ptr<Omega_h::Input>::~shared_ptr((shared_ptr<Omega_h::Input> *)local_30);
  return;
}

Assistant:

void InputMap::set(std::string const& name, char const* value) {
  std::shared_ptr<Input> sptr(new InputScalar(value));
  this->add(name, std::move(sptr));
}